

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_insert.cpp
# Opt level: O3

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::StructInsertStats(duckdb *this,ClientContext *context,FunctionStatisticsInput *input)

{
  vector<duckdb::BaseStatistics,_true> *this_00;
  reference pvVar1;
  ulong uVar2;
  BaseStatistics *pBVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  size_type __n;
  BaseStatistics new_stats;
  LogicalType local_a0 [24];
  BaseStatistics local_88 [88];
  
  lVar4 = *(long *)input;
  this_00 = *(vector<duckdb::BaseStatistics,_true> **)(input + 0x10);
  duckdb::LogicalType::LogicalType(local_a0,(LogicalType *)(lVar4 + 0x38));
  duckdb::StructStats::CreateUnknown(local_88);
  duckdb::LogicalType::~LogicalType(local_a0);
  pvVar1 = vector<duckdb::BaseStatistics,_true>::operator[](this_00,0);
  uVar2 = duckdb::StructType::GetChildCount((LogicalType *)pvVar1);
  pvVar1 = vector<duckdb::BaseStatistics,_true>::operator[](this_00,0);
  pBVar3 = (BaseStatistics *)duckdb::StructStats::GetChildStats(pvVar1);
  if (uVar2 != 0) {
    uVar6 = 0;
    do {
      duckdb::StructStats::SetChildStats(local_88,uVar6,pBVar3);
      uVar6 = uVar6 + 1;
      pBVar3 = pBVar3 + 0x58;
    } while (uVar2 != uVar6);
  }
  lVar4 = duckdb::StructType::GetChildCount((LogicalType *)(lVar4 + 0x38));
  lVar5 = *(long *)(this_00 + 8) - *(long *)this_00 >> 3;
  if (1 < (ulong)(lVar5 * 0x2e8ba2e8ba2e8ba3)) {
    __n = 1;
    do {
      pvVar1 = vector<duckdb::BaseStatistics,_true>::operator[](this_00,__n);
      duckdb::StructStats::SetChildStats(local_88,lVar5 * -0x2e8ba2e8ba2e8ba3 + lVar4 + __n,pvVar1);
      __n = __n + 1;
    } while (__n < (ulong)((*(long *)(this_00 + 8) - *(long *)this_00 >> 3) * 0x2e8ba2e8ba2e8ba3));
  }
  duckdb::BaseStatistics::ToUnique();
  duckdb::BaseStatistics::~BaseStatistics(local_88);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

unique_ptr<BaseStatistics> StructInsertStats(ClientContext &context, FunctionStatisticsInput &input) {
	auto &child_stats = input.child_stats;
	auto &expr = input.expr;
	auto new_stats = StructStats::CreateUnknown(expr.return_type);

	auto existing_count = StructType::GetChildCount(child_stats[0].GetType());
	auto existing_stats = StructStats::GetChildStats(child_stats[0]);
	for (idx_t i = 0; i < existing_count; i++) {
		StructStats::SetChildStats(new_stats, i, existing_stats[i]);
	}

	auto new_count = StructType::GetChildCount(expr.return_type);
	auto offset = new_count - child_stats.size();
	for (idx_t i = 1; i < child_stats.size(); i++) {
		StructStats::SetChildStats(new_stats, offset + i, child_stats[i]);
	}
	return new_stats.ToUnique();
}